

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O1

bool XPMP2::FindResFile(char *fName,string *outPath,bool bRequired)

{
  bool bVar1;
  string path;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,DAT_002ef658,DAT_002ef660 + DAT_002ef658);
  std::__cxx11::string::append((char *)&local_50);
  bVar1 = ExistsFile(&local_50);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)outPath,(string *)&local_50);
  }
  else if ((bRequired) && (glob < 5)) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
           ,0x35,"FindResFile",logFATAL,"File \'%s\' is missing in resource directory \'%s\'",fName,
           DAT_002ef658);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool FindResFile (const char* fName, std::string& outPath,
                         bool bRequired = true)
{
    std::string path = glob.resourceDir + fName;
    if (ExistsFile(path)) {
        outPath = std::move(path);
        return true;
    } else {
        if (bRequired) {
            LOG_MSG(logFATAL, ERR_RSRC_FILE_UNAVAIL,
                    fName, glob.resourceDir.c_str());
        }
        return false;
    }
}